

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O3

void __thiscall twitter::zipkin::thrift::Annotation::Annotation(Annotation *this,Annotation *other2)

{
  _Endpoint__isset *p_Var1;
  
  *(undefined ***)this = &PTR__Annotation_002688c0;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  *(undefined ***)&this->host = &PTR__Endpoint_00268858;
  (this->host).ipv4 = 0;
  (this->host).port = 0;
  (this->host).service_name._M_dataplus._M_p = (pointer)&(this->host).service_name.field_2;
  (this->host).service_name._M_string_length = 0;
  (this->host).service_name.field_2._M_local_buf[0] = '\0';
  (this->host).ipv6._M_dataplus._M_p = (pointer)&(this->host).ipv6.field_2;
  (this->host).ipv6._M_string_length = 0;
  (this->host).ipv6.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->host).__isset;
  *p_Var1 = (_Endpoint__isset)((byte)*p_Var1 & 0xf0);
  this->__isset = (_Annotation__isset)((byte)this->__isset & 0xf8);
  this->timestamp = other2->timestamp;
  std::__cxx11::string::_M_assign((string *)&this->value);
  (this->host).ipv4 = (other2->host).ipv4;
  (this->host).port = (other2->host).port;
  std::__cxx11::string::_M_assign((string *)&(this->host).service_name);
  std::__cxx11::string::_M_assign((string *)&(this->host).ipv6);
  (this->host).__isset = (other2->host).__isset;
  this->__isset = other2->__isset;
  return;
}

Assistant:

Annotation::Annotation(const Annotation& other2) {
  timestamp = other2.timestamp;
  value = other2.value;
  host = other2.host;
  __isset = other2.__isset;
}